

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_4::GLES2Program::GLES2Program(GLES2Program *this,Functions *gl)

{
  glGetAttribLocationFunc p_Var1;
  Functions *gl_00;
  deUint32 dVar2;
  GLint GVar3;
  ProgramSources local_e8;
  Functions *local_18;
  Functions *gl_local;
  GLES2Program *this_local;
  
  local_18 = gl;
  gl_local = (Functions *)this;
  anon_unknown_4::Program::Program(&this->super_Program);
  gl_00 = local_18;
  (this->super_Program)._vptr_Program = (_func_int **)&PTR__GLES2Program_0327e570;
  this->m_gl = local_18;
  getProgramSourcesES2();
  glu::ShaderProgram::ShaderProgram(&this->m_program,gl_00,&local_e8);
  glu::ProgramSources::~ProgramSources(&local_e8);
  this->m_positionLoc = 0;
  this->m_colorLoc = 0;
  p_Var1 = this->m_gl->getAttribLocation;
  dVar2 = glu::ShaderProgram::getProgram(&this->m_program);
  GVar3 = (*p_Var1)(dVar2,"a_position");
  this->m_positionLoc = GVar3;
  p_Var1 = this->m_gl->getAttribLocation;
  dVar2 = glu::ShaderProgram::getProgram(&this->m_program);
  GVar3 = (*p_Var1)(dVar2,"a_color");
  this->m_colorLoc = GVar3;
  return;
}

Assistant:

GLES2Program (const glw::Functions& gl)
		: m_gl				(gl)
		, m_program			(gl, getProgramSourcesES2())
		, m_positionLoc		(0)
		, m_colorLoc		(0)
	{

		m_positionLoc	= m_gl.getAttribLocation(m_program.getProgram(), "a_position");
		m_colorLoc		= m_gl.getAttribLocation(m_program.getProgram(), "a_color");
	}